

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_enemy.cpp
# Opt level: O3

int AF_AActor_A_Detonate
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  PClass *pPVar1;
  int iVar2;
  undefined4 extraout_var;
  AActor *this;
  AActor *bombsource;
  char *__assertion;
  bool bVar4;
  FName local_1c;
  PClass *pPVar3;
  
  pPVar1 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_003f6d41;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003f6d31:
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003f6d41:
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                  ,0xd52,
                  "int AF_AActor_A_Detonate(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  this = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (this == (AActor *)0x0) goto LAB_003f6cc1;
    pPVar3 = (this->super_DThinker).super_DObject.Class;
    if (pPVar3 == (PClass *)0x0) {
      iVar2 = (**(this->super_DThinker).super_DObject._vptr_DObject)(this);
      pPVar3 = (PClass *)CONCAT44(extraout_var,iVar2);
      (this->super_DThinker).super_DObject.Class = pPVar3;
    }
    bVar4 = pPVar3 != (PClass *)0x0;
    if (pPVar3 != pPVar1 && bVar4) {
      do {
        pPVar3 = pPVar3->ParentClass;
        bVar4 = pPVar3 != (PClass *)0x0;
        if (pPVar3 == pPVar1) break;
      } while (pPVar3 != (PClass *)0x0);
    }
    if (!bVar4) {
      __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003f6d41;
    }
  }
  else {
    if (this != (AActor *)0x0) goto LAB_003f6d31;
LAB_003f6cc1:
    this = (AActor *)0x0;
  }
  iVar2 = AActor::GetMissileDamage(this,0,1);
  bombsource = (this->target).field_0.p;
  if (bombsource != (AActor *)0x0) {
    if (((bombsource->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) goto LAB_003f6cf3;
    (this->target).field_0.p = (AActor *)0x0;
  }
  bombsource = (AActor *)0x0;
LAB_003f6cf3:
  local_1c.Index = (this->DamageType).super_FName.Index;
  P_RadiusAttack(this,bombsource,iVar2,iVar2,&local_1c,1,0);
  P_CheckSplash(this,(double)iVar2);
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_Detonate)
{
	PARAM_SELF_PROLOGUE(AActor);
	int damage = self->GetMissileDamage(0, 1);
	P_RadiusAttack (self, self->target, damage, damage, self->DamageType, RADF_HURTSOURCE);
	P_CheckSplash(self, damage);
	return 0;
}